

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

IStream * Catch::makeStream(StringRef *filename)

{
  bool bVar1;
  char cVar2;
  StringRef *in_RDI;
  ReusableStringStream *in_stack_ffffffffffffff48;
  ReusableStringStream *in_stack_ffffffffffffff50;
  StringRef *in_stack_ffffffffffffff58;
  StringRef *in_stack_ffffffffffffff60;
  CoutStream *in_stack_ffffffffffffff70;
  ReusableStringStream *in_stack_ffffffffffffff80;
  FileStream *in_stack_ffffffffffffffd0;
  StringRef in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  bVar1 = StringRef::empty(in_RDI);
  if (bVar1) {
    local_8 = (DebugOutStream *)operator_new(0x118);
    Detail::anon_unknown_0::CoutStream::CoutStream(in_stack_ffffffffffffff70);
  }
  else {
    cVar2 = StringRef::operator[](in_RDI,0);
    if (cVar2 == '%') {
      StringRef::StringRef(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      bVar1 = StringRef::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (!bVar1) {
        ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff80);
        ReusableStringStream::operator<<
                  (in_stack_ffffffffffffff50,(char (*) [23])in_stack_ffffffffffffff48);
        ReusableStringStream::operator<<
                  (in_stack_ffffffffffffff50,(StringRef *)in_stack_ffffffffffffff48);
        ReusableStringStream::operator<<
                  (in_stack_ffffffffffffff50,(char (*) [2])in_stack_ffffffffffffff48);
        ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff48);
        throw_domain_error((string *)in_stack_ffffffffffffff70);
      }
      local_8 = (DebugOutStream *)operator_new(0x120);
      Detail::anon_unknown_0::DebugOutStream::DebugOutStream(local_8);
    }
    else {
      local_8 = (DebugOutStream *)operator_new(0x208);
      Detail::anon_unknown_0::FileStream::FileStream
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
    }
  }
  return &local_8->super_IStream;
}

Assistant:

auto makeStream( StringRef const &filename ) -> IStream const* {
        if( filename.empty() )
            return new Detail::CoutStream();
        else if( filename[0] == '%' ) {
            if( filename == "%debug" )
                return new Detail::DebugOutStream();
            else
                CATCH_ERROR( "Unrecognised stream: '" << filename << "'" );
        }
        else
            return new Detail::FileStream( filename );
    }